

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void put_list_obj(char **dstp,vm_obj_id_t objval)

{
  vm_val_t val;
  vm_val_t local_18;
  
  local_18.typ = VM_OBJ;
  local_18.val.obj = objval;
  vmb_put_dh(*dstp,&local_18);
  *dstp = *dstp + 5;
  return;
}

Assistant:

static void put_list_obj(char **dstp, vm_obj_id_t objval)
{
    vm_val_t val;

    /* set up the integer value */
    val.set_obj(objval);

    /* write it to the list */
    vmb_put_dh(*dstp, &val);

    /* advance the output pointer */
    *dstp += VMB_DATAHOLDER;
}